

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

ssize_t __thiscall input_mod::read(input_mod *this,int __fd,void *__buf,size_t __nbytes)

{
  FCriticalSection *this_00;
  int iVar1;
  ulong uVar2;
  void *buffer;
  ulong __n;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  
  buffer = (void *)CONCAT44(in_register_00000034,__fd);
  __n = (ulong)__buf & 0xffffffff;
  if (*(char *)(__nbytes + 0x60) == '\x01') {
    sVar3 = 0;
    memset(buffer,0,(long)(int)__buf);
  }
  else {
    this_00 = (FCriticalSection *)(__nbytes + 0x80);
    FCriticalSection::Enter(this_00);
    for (; 0 < (int)__n; __n = (ulong)(uint)((int)__n + iVar1 * -8)) {
      iVar1 = decode_run((input_mod *)__nbytes,buffer,(uint)(__n >> 3));
      if (iVar1 < 0) {
        FCriticalSection::Leave(this_00);
        return 0;
      }
      if (iVar1 == 0) {
        FCriticalSection::Leave(this_00);
        memset(buffer,0,__n);
        goto LAB_00357303;
      }
      for (uVar2 = 0; (uint)(iVar1 * 2) != uVar2; uVar2 = uVar2 + 1) {
        *(float *)((long)buffer + uVar2 * 4) =
             (float)*(int *)((long)buffer + uVar2 * 4) * 5.9604645e-08 * mod_dumb_mastervolume.Value
        ;
      }
      buffer = (void *)((long)buffer + (ulong)(uint)(iVar1 * 8));
    }
    FCriticalSection::Leave(this_00);
LAB_00357303:
    sVar3 = CONCAT71((int7)(__n >> 8),1);
  }
  return sVar3;
}

Assistant:

bool input_mod::read(SoundStream *stream, void *buffer, int sizebytes, void *userdata)
{
	input_mod *state = (input_mod *)userdata;
	if (state->eof)
	{
		memset(buffer, 0, sizebytes);
		return false;
	}
	state->crit_sec.Enter();
	while (sizebytes > 0)
	{
		int written = state->decode_run(buffer, sizebytes / 8);
		if (written < 0)
		{
			state->crit_sec.Leave();
			return false;
		}
		if (written == 0)
		{
			state->crit_sec.Leave();
			memset(buffer, 0, sizebytes);
			return true;
		}
		else
		{
			// Convert to float
			for (int i = 0; i < written * 2; ++i)
			{
				((float *)buffer)[i] = (((int *)buffer)[i] / (float)(1 << 24)) * mod_dumb_mastervolume;
			}
		}
		buffer = (BYTE *)buffer + written * 8;
		sizebytes -= written * 8;
	}
	state->crit_sec.Leave();
	return true;
}